

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O3

void tcg_register_jit_mips(TCGContext_conflict3 *s,void *buf,size_t buf_size)

{
  char *strtab;
  jit_code_entry *pjVar1;
  uint8_t *puVar2;
  int iVar3;
  gpointer __dest;
  uintptr_t buf_1;
  
  __dest = g_malloc(0x34a);
  memcpy(__dest,&tcg_register_jit_int_img_template,0x310);
  *(void **)((long)__dest + 0x50) = buf;
  *(void **)((long)__dest + 0x58) = buf;
  *(size_t *)((long)__dest + 0x68) = buf_size;
  strtab = (char *)((long)__dest + 0x2c0);
  iVar3 = find_string(strtab,".text");
  *(int *)((long)__dest + 0xb8) = iVar3;
  *(void **)((long)__dest + 200) = buf;
  *(size_t *)((long)__dest + 0xd8) = buf_size;
  iVar3 = find_string(strtab,".debug_info");
  *(int *)((long)__dest + 0xf8) = iVar3;
  iVar3 = find_string(strtab,".debug_abbrev");
  *(int *)((long)__dest + 0x138) = iVar3;
  iVar3 = find_string(strtab,".debug_frame");
  *(int *)((long)__dest + 0x178) = iVar3;
  *(undefined8 *)((long)__dest + 0x198) = 0x3a;
  iVar3 = find_string(strtab,".symtab");
  *(int *)((long)__dest + 0x1b8) = iVar3;
  iVar3 = find_string(strtab,".strtab");
  *(int *)((long)__dest + 0x1f8) = iVar3;
  iVar3 = find_string(strtab,"code_gen_buffer");
  *(int *)((long)__dest + 0x250) = iVar3;
  *(void **)((long)__dest + 600) = buf;
  *(size_t *)((long)__dest + 0x260) = buf_size;
  *(void **)((long)__dest + 0x276) = buf;
  *(size_t *)((long)__dest + 0x27e) = (long)buf + buf_size;
  *(void **)((long)__dest + 0x297) = buf;
  *(size_t *)((long)__dest + 0x29f) = (long)buf + buf_size;
  *(undefined8 *)((long)__dest + 800) = 0x26;
  *(uintptr_t *)((long)__dest + 0x328) = 0;
  *(uintptr_t *)((long)__dest + 0x330) = 0;
  *(undefined8 *)((long)__dest + 0x338) = 0x286019009c0070c;
  *(DebugFrameCIE *)((long)__dest + 0x310) = debug_frame.h.cie;
  *(undefined8 *)((long)__dest + 0x33a) = 0x3830286019009c0;
  puVar2 = (uint8_t *)((long)__dest + 0x342);
  puVar2[0] = 0x8c;
  puVar2[1] = '\x04';
  puVar2[2] = 0x8d;
  puVar2[3] = '\x05';
  puVar2[4] = 0x8e;
  puVar2[5] = '\x06';
  puVar2[6] = 0x8f;
  puVar2[7] = '\a';
  *(void **)((long)__dest + 0x328) = buf;
  *(size_t *)((long)__dest + 0x330) = buf_size;
  pjVar1 = s->one_entry;
  pjVar1->symfile_addr = __dest;
  pjVar1->symfile_size = 0x34a;
  return;
}

Assistant:

void tcg_register_jit(TCGContext *s, void *buf, size_t buf_size)
{
    tcg_register_jit_int(s, buf, buf_size, &debug_frame, sizeof(debug_frame));
}